

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O2

void __thiscall
ScriptMemoryDumper::
DumpHeapBucket<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (ScriptMemoryDumper *this,uint index,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *pSVar1;
  
  pSVar1 = &heapBucket->allocatorHead;
  do {
    DumpSmallHeapBlock<SmallAllocationBlockAttributes>
              (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)pSVar1->heapBlock);
    pSVar1 = pSVar1->next;
  } while (pSVar1 != &heapBucket->allocatorHead);
  Memory::HeapBlockList::
  ForEach<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>,ScriptMemoryDumper::DumpSmallHeapBlockList<SmallAllocationBlockAttributes>(Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBucket->fullBlockList,
             (anon_class_8_1_8991fb9c)this);
  Memory::HeapBlockList::
  ForEach<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>,ScriptMemoryDumper::DumpSmallHeapBlockList<SmallAllocationBlockAttributes>(Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>*)::_lambda(Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBucket->heapBlockList,
             (anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void ScriptMemoryDumper::DumpHeapBucket(uint index, HeapBucketT<TBlockType>* heapBucket)
{
    SmallHeapBlockAllocator<TBlockType> * currentAllocator = heapBucket->GetAllocator();
    do
    {
        DumpSmallHeapBlock(currentAllocator->GetHeapBlock());
        currentAllocator = currentAllocator->GetNext();
    }
    while (currentAllocator != heapBucket->GetAllocator());

    DumpSmallHeapBlockList(heapBucket->fullBlockList);
    DumpSmallHeapBlockList(heapBucket->heapBlockList);
}